

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.h
# Opt level: O1

bool __thiscall pbrt::Integrator::Unoccluded(Integrator *this,Interaction *p0,Interaction *p1)

{
  bool bVar1;
  long in_FS_OFFSET;
  Ray local_30;
  
  Interaction::SpawnRayTo(&local_30,p0,p1);
  *(long *)(in_FS_OFFSET + -0x378) = *(long *)(in_FS_OFFSET + -0x378) + 1;
  if (((this->aggregate).
       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
       .bits & 0xffffffffffff) == 0) {
    bVar1 = true;
  }
  else {
    bVar1 = PrimitiveHandle::IntersectP(&this->aggregate,&local_30,0.9999);
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool Unoccluded(const Interaction &p0, const Interaction &p1) const {
        return !IntersectP(p0.SpawnRayTo(p1), 1 - ShadowEpsilon);
    }